

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O3

UnicodeString *
icu_63::number::impl::PatternStringUtils::convertLocalized
          (UnicodeString *__return_storage_ptr__,UnicodeString *input,DecimalFormatSymbols *symbols,
          bool toLocalized,UErrorCode *status)

{
  short sVar1;
  undefined4 newLength;
  bool bVar2;
  UBool UVar3;
  long lVar4;
  int32_t iVar5;
  int iVar6;
  uint uVar7;
  char16_t *pcVar8;
  char16_t cVar9;
  uint start;
  UnicodeString *src;
  undefined4 uVar10;
  UnicodeString *pUVar11;
  uint uVar12;
  uint uVar13;
  UnicodeString temp;
  UnicodeString local_af8;
  UnicodeString local_ab8 [22];
  UnicodeString aUStack_538 [20];
  
  lVar4 = 8;
  do {
    *(undefined ***)((long)local_ab8 + lVar4 + -8) = &PTR__UnicodeString_003e4fd8;
    *(undefined2 *)((long)&local_ab8[0].super_Replaceable.super_UObject._vptr_UObject + lVar4) = 2;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0xa88);
  UnicodeString::UnicodeString(&temp,L"%");
  bVar2 = !toLocalized;
  UnicodeString::moveFrom(local_ab8 + bVar2,&temp);
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::operator=(local_ab8 + toLocalized,(UnicodeString *)&symbols->field_0xc8);
  UnicodeString::UnicodeString(&temp,L"‰");
  UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 2,&temp);
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 2,(UnicodeString *)&symbols->field_0x308);
  UnicodeString::UnicodeString(&temp,L".");
  UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 4,&temp);
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::operator=(local_ab8 + (ulong)toLocalized + 4,(UnicodeString *)&symbols->field_0x8);
  UnicodeString::UnicodeString(&temp,L",");
  UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 6,&temp);
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::operator=(local_ab8 + (ulong)toLocalized + 6,(UnicodeString *)&symbols->field_0x48)
  ;
  UnicodeString::UnicodeString(&temp,L"-");
  UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 8,&temp);
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 8,(UnicodeString *)&symbols->field_0x188);
  UnicodeString::UnicodeString(&temp,L"+");
  UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 10,&temp);
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 10,(UnicodeString *)&symbols->field_0x1c8);
  UnicodeString::UnicodeString(&temp,L";");
  UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 0xc,&temp);
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 0xc,(UnicodeString *)&symbols->field_0x88);
  UnicodeString::UnicodeString(&temp,L"@");
  UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 0xe,&temp);
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 0xe,(UnicodeString *)&symbols->field_0x408);
  UnicodeString::UnicodeString(&temp,L"E");
  UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 0x10,&temp);
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 0x10,(UnicodeString *)&symbols->field_0x2c8);
  UnicodeString::UnicodeString(&temp,L"*");
  UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 0x12,&temp);
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 0x12,(UnicodeString *)&symbols->field_0x348);
  UnicodeString::UnicodeString(&temp,L"#");
  UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 0x14,&temp);
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 0x14,(UnicodeString *)&symbols->field_0x148);
  pUVar11 = (UnicodeString *)&symbols->field_0x448;
  lVar4 = 0;
  uVar12 = 0;
  do {
    sVar1 = *(short *)((long)&aUStack_538[bVar2].fUnion + lVar4);
    if (sVar1 < 0) {
      iVar5 = *(int32_t *)((long)&aUStack_538[bVar2].fUnion + lVar4 + 4);
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    UnicodeString::replace
              ((UnicodeString *)
               ((long)&aUStack_538[bVar2].super_Replaceable.super_UObject._vptr_UObject + lVar4),0,
               iVar5,uVar12 | 0x30);
    src = pUVar11;
    if (lVar4 == 0) {
      src = (UnicodeString *)&symbols->field_0x108;
    }
    UnicodeString::operator=
              ((UnicodeString *)
               ((long)&aUStack_538[toLocalized].super_Replaceable.super_UObject._vptr_UObject +
               lVar4),src);
    uVar12 = uVar12 + 1;
    lVar4 = lVar4 + 0x80;
    pUVar11 = pUVar11 + 1;
  } while (lVar4 != 0x500);
  lVar4 = 0;
  do {
    UnicodeString::UnicodeString(&temp,L'\'');
    UnicodeString::UnicodeString(&local_af8,L'’');
    sVar1 = *(short *)((long)&local_ab8[toLocalized].fUnion + lVar4);
    if (sVar1 < 0) {
      iVar5 = *(int32_t *)((long)&local_ab8[toLocalized].fUnion + lVar4 + 4);
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    uVar10 = temp.fUnion.fFields.fLength;
    if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
      uVar10 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    newLength = local_af8.fUnion.fFields.fLength;
    if (-1 < local_af8.fUnion.fStackFields.fLengthAndFlags) {
      newLength = (int)local_af8.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::findAndReplace
              ((UnicodeString *)
               ((long)&local_ab8[toLocalized].super_Replaceable.super_UObject._vptr_UObject + lVar4)
               ,0,iVar5,&temp,0,uVar10,&local_af8,0,newLength);
    UnicodeString::~UnicodeString(&local_af8);
    UnicodeString::~UnicodeString(&temp);
    lVar4 = lVar4 + 0x80;
  } while (lVar4 != 0xa80);
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e4fd8;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
  uVar12 = (uint)sVar1;
  if (sVar1 < 0) {
    uVar7 = (input->fUnion).fFields.fLength;
  }
  else {
    uVar7 = (int)uVar12 >> 5;
  }
  if (0 < (int)uVar7) {
    uVar13 = 0;
    start = 0;
    do {
      cVar9 = L'\xffff';
      if (start < uVar7) {
        pcVar8 = (char16_t *)((long)&input->fUnion + 2);
        if ((uVar12 & 2) == 0) {
          pcVar8 = (input->fUnion).fFields.fArray;
        }
        cVar9 = pcVar8[(int)start];
        if (cVar9 != L'\'') goto LAB_002674fd;
        switch(uVar13) {
        case 0:
          temp.super_Replaceable.super_UObject._vptr_UObject._0_2_ = L'\'';
          UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&temp,0,1);
          uVar13 = 1;
          break;
        case 2:
          uVar13 = 3;
          break;
        case 4:
          uVar13 = 5;
          break;
        default:
          temp.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x27;
          UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&temp,0,1);
          temp.super_Replaceable.super_UObject._vptr_UObject._0_2_ = L'\'';
          UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&temp,0,1);
          uVar13 = 4;
        }
      }
      else {
LAB_002674fd:
        if ((uVar13 < 5) && ((0x19U >> uVar13 & 1) != 0)) {
          lVar4 = 0xa80;
          pUVar11 = local_ab8;
          do {
            sVar1 = (pUVar11->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar5 = (pUVar11->fUnion).fFields.fLength;
            }
            else {
              iVar5 = (int)sVar1 >> 5;
            }
            UnicodeString::tempSubString(&temp,input,start,iVar5);
            if ((temp.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
              uVar10 = temp.fUnion.fFields.fLength;
              if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
                uVar10 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              sVar1 = (pUVar11->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar6 = (pUVar11->fUnion).fFields.fLength;
              }
              else {
                iVar6 = (int)sVar1 >> 5;
              }
              if ((((int)sVar1 & 1U) == 0) && (uVar10 == iVar6)) {
                UVar3 = UnicodeString::doEquals(&temp,pUVar11,uVar10);
                bVar2 = UVar3 != '\0';
                goto LAB_00267596;
              }
            }
            else {
              bVar2 = (bool)(*(byte *)&pUVar11->fUnion & 1);
LAB_00267596:
              if (bVar2 != false) {
                sVar1 = (pUVar11->fUnion).fStackFields.fLengthAndFlags;
                if (sVar1 < 0) {
                  iVar6 = (pUVar11->fUnion).fFields.fLength;
                }
                else {
                  iVar6 = (int)sVar1 >> 5;
                }
                if (uVar13 - 3 < 2) {
                  local_af8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = L'\'';
                  UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&local_af8,0,1);
                  uVar13 = 0;
                }
                sVar1 = pUVar11[1].fUnion.fStackFields.fLengthAndFlags;
                if (sVar1 < 0) {
                  iVar5 = pUVar11[1].fUnion.fFields.fLength;
                }
                else {
                  iVar5 = (int)sVar1 >> 5;
                }
                UnicodeString::doAppend(__return_storage_ptr__,pUVar11 + 1,0,iVar5);
                start = (start + iVar6) - 1;
                goto LAB_00267765;
              }
            }
            UnicodeString::~UnicodeString(&temp);
            pUVar11 = pUVar11 + 2;
            lVar4 = lVar4 + -0x80;
          } while (lVar4 != 0);
          lVar4 = 0xa80;
          pUVar11 = local_ab8 + 1;
          do {
            sVar1 = (pUVar11->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar5 = (pUVar11->fUnion).fFields.fLength;
            }
            else {
              iVar5 = (int)sVar1 >> 5;
            }
            UnicodeString::tempSubString(&temp,input,start,iVar5);
            if ((temp.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
              bVar2 = (bool)(*(byte *)&pUVar11->fUnion & 1);
LAB_00267633:
              if (bVar2 == false) goto LAB_0026763b;
              if (uVar13 == 0) {
                local_af8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x27;
                UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&local_af8,0,1);
                uVar13 = 4;
              }
              local_af8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = cVar9;
              UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&local_af8,0,1);
LAB_00267765:
              UnicodeString::~UnicodeString(&temp);
              goto LAB_0026776d;
            }
            uVar10 = temp.fUnion.fFields.fLength;
            if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
              uVar10 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            sVar1 = (pUVar11->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar6 = (pUVar11->fUnion).fFields.fLength;
            }
            else {
              iVar6 = (int)sVar1 >> 5;
            }
            if ((((int)sVar1 & 1U) == 0) && (uVar10 == iVar6)) {
              UVar3 = UnicodeString::doEquals(&temp,pUVar11,uVar10);
              bVar2 = UVar3 != '\0';
              goto LAB_00267633;
            }
LAB_0026763b:
            UnicodeString::~UnicodeString(&temp);
            pUVar11 = pUVar11 + 2;
            lVar4 = lVar4 + -0x80;
          } while (lVar4 != 0);
          if (uVar13 - 3 < 2) {
            temp.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x27;
            UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&temp,0,1);
            uVar13 = 0;
          }
          temp.super_Replaceable.super_UObject._vptr_UObject._0_2_ = cVar9;
          UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&temp,0,1);
        }
        else {
          temp.super_Replaceable.super_UObject._vptr_UObject._0_2_ = cVar9;
          UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&temp,0,1);
          uVar13 = 2;
        }
      }
LAB_0026776d:
      sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
      uVar12 = (uint)sVar1;
      if (sVar1 < 0) {
        uVar7 = (input->fUnion).fFields.fLength;
      }
      else {
        uVar7 = (int)uVar12 >> 5;
      }
      start = start + 1;
    } while ((int)start < (int)uVar7);
    if (uVar13 - 3 < 2) {
      temp.super_Replaceable.super_UObject._vptr_UObject._0_2_ = L'\'';
      UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&temp,0,1);
    }
    else if (uVar13 != 0) {
      *status = U_PATTERN_SYNTAX_ERROR;
    }
  }
  lVar4 = 0xa40;
  do {
    UnicodeString::~UnicodeString
              ((UnicodeString *)
               ((long)&local_ab8[0].super_Replaceable.super_UObject._vptr_UObject + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PatternStringUtils::convertLocalized(const UnicodeString& input, const DecimalFormatSymbols& symbols,
                                     bool toLocalized, UErrorCode& status) {
    // Construct a table of strings to be converted between localized and standard.
    static constexpr int32_t LEN = 21;
    UnicodeString table[LEN][2];
    int standIdx = toLocalized ? 0 : 1;
    int localIdx = toLocalized ? 1 : 0;
    table[0][standIdx] = u"%";
    table[0][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPercentSymbol);
    table[1][standIdx] = u"‰";
    table[1][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPerMillSymbol);
    table[2][standIdx] = u".";
    table[2][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kDecimalSeparatorSymbol);
    table[3][standIdx] = u",";
    table[3][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kGroupingSeparatorSymbol);
    table[4][standIdx] = u"-";
    table[4][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kMinusSignSymbol);
    table[5][standIdx] = u"+";
    table[5][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPlusSignSymbol);
    table[6][standIdx] = u";";
    table[6][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPatternSeparatorSymbol);
    table[7][standIdx] = u"@";
    table[7][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kSignificantDigitSymbol);
    table[8][standIdx] = u"E";
    table[8][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kExponentialSymbol);
    table[9][standIdx] = u"*";
    table[9][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPadEscapeSymbol);
    table[10][standIdx] = u"#";
    table[10][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kDigitSymbol);
    for (int i = 0; i < 10; i++) {
        table[11 + i][standIdx] = u'0' + i;
        table[11 + i][localIdx] = symbols.getConstDigitSymbol(i);
    }

    // Special case: quotes are NOT allowed to be in any localIdx strings.
    // Substitute them with '’' instead.
    for (int32_t i = 0; i < LEN; i++) {
        table[i][localIdx].findAndReplace(u'\'', u'’');
    }

    // Iterate through the string and convert.
    // State table:
    // 0 => base state
    // 1 => first char inside a quoted sequence in input and output string
    // 2 => inside a quoted sequence in input and output string
    // 3 => first char after a close quote in input string;
    // close quote still needs to be written to output string
    // 4 => base state in input string; inside quoted sequence in output string
    // 5 => first char inside a quoted sequence in input string;
    // inside quoted sequence in output string
    UnicodeString result;
    int state = 0;
    for (int offset = 0; offset < input.length(); offset++) {
        UChar ch = input.charAt(offset);

        // Handle a quote character (state shift)
        if (ch == u'\'') {
            if (state == 0) {
                result.append(u'\'');
                state = 1;
                continue;
            } else if (state == 1) {
                result.append(u'\'');
                state = 0;
                continue;
            } else if (state == 2) {
                state = 3;
                continue;
            } else if (state == 3) {
                result.append(u'\'');
                result.append(u'\'');
                state = 1;
                continue;
            } else if (state == 4) {
                state = 5;
                continue;
            } else {
                U_ASSERT(state == 5);
                result.append(u'\'');
                result.append(u'\'');
                state = 4;
                continue;
            }
        }

        if (state == 0 || state == 3 || state == 4) {
            for (auto& pair : table) {
                // Perform a greedy match on this symbol string
                UnicodeString temp = input.tempSubString(offset, pair[0].length());
                if (temp == pair[0]) {
                    // Skip ahead past this region for the next iteration
                    offset += pair[0].length() - 1;
                    if (state == 3 || state == 4) {
                        result.append(u'\'');
                        state = 0;
                    }
                    result.append(pair[1]);
                    goto continue_outer;
                }
            }
            // No replacement found. Check if a special quote is necessary
            for (auto& pair : table) {
                UnicodeString temp = input.tempSubString(offset, pair[1].length());
                if (temp == pair[1]) {
                    if (state == 0) {
                        result.append(u'\'');
                        state = 4;
                    }
                    result.append(ch);
                    goto continue_outer;
                }
            }
            // Still nothing. Copy the char verbatim. (Add a close quote if necessary)
            if (state == 3 || state == 4) {
                result.append(u'\'');
                state = 0;
            }
            result.append(ch);
        } else {
            U_ASSERT(state == 1 || state == 2 || state == 5);
            result.append(ch);
            state = 2;
        }
        continue_outer:;
    }
    // Resolve final quotes
    if (state == 3 || state == 4) {
        result.append(u'\'');
        state = 0;
    }
    if (state != 0) {
        // Malformed localized pattern: unterminated quote
        status = U_PATTERN_SYNTAX_ERROR;
    }
    return result;
}